

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateTime.h
# Opt level: O0

void __thiscall
DateTime::Initialise
          (DateTime *this,int year,int month,int day,int hour,int minute,int second,int microsecond)

{
  bool bVar1;
  int days;
  int64_t iVar2;
  TimeSpan local_30;
  int local_24;
  int local_20;
  int minute_local;
  int hour_local;
  int day_local;
  int month_local;
  int year_local;
  DateTime *this_local;
  
  local_24 = minute;
  local_20 = hour;
  minute_local = day;
  hour_local = month;
  day_local = year;
  _month_local = this;
  bVar1 = IsValidYearMonthDay(year,month,day);
  if ((((((bVar1) && (-1 < local_20)) && (local_20 < 0x18)) &&
       ((-1 < local_24 && (local_24 < 0x3c)))) &&
      ((-1 < second && ((second < 0x3c && (-1 < microsecond)))))) && (microsecond < 1000000)) {
    days = AbsoluteDays(this,day_local,hour_local,minute_local);
    TimeSpan::TimeSpan(&local_30,days,local_20,local_24,second,microsecond);
    iVar2 = TimeSpan::Ticks(&local_30);
    this->m_encoded = iVar2;
    return;
  }
  __assert_fail("false && \"Invalid date\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/enferex[P]satnow/third-party/sgp4/libsgp4/DateTime.h"
                ,0x7f,"void DateTime::Initialise(int, int, int, int, int, int, int)");
}

Assistant:

void Initialise(int year,
            int month,
            int day,
            int hour,
            int minute,
            int second,
            int microsecond)
    {
        if (!IsValidYearMonthDay(year, month, day) ||
                hour < 0 || hour > 23 ||
                minute < 0 || minute > 59 ||
                second < 0 || second > 59 ||
                microsecond < 0 || microsecond > 999999)
        {
            assert(false && "Invalid date");
        }
        m_encoded = TimeSpan(
                AbsoluteDays(year, month, day),
                hour,
                minute,
                second,
                microsecond).Ticks();
    }